

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

void __thiscall OpenMD::EAM::initialize(EAM *this)

{
  bool bVar1;
  undefined1 uVar2;
  AtomType *pAVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long in_RDI;
  EAM *this_00;
  RealType Cj;
  RealType Ci;
  RealType A_1;
  RealType alpha_1;
  RealType re_1;
  RealType lambda;
  RealType kappa;
  RealType B;
  RealType A;
  RealType beta;
  RealType alpha;
  RealType re;
  int nr;
  RealType dr;
  vector<double,_std::allocator<double>_> phiAB;
  EAMInteractionType *eamit;
  AtomType *at2;
  AtomType *at1;
  NonBondedInteractionType *nbt;
  KeyType keys;
  MapTypeIterator j;
  NonBondedInteractionTypeContainer *nbiTypes;
  iterator at;
  string EAMMixMeth;
  ForceFieldOptions *fopts;
  AtomType *in_stack_00000848;
  EAM *in_stack_00000850;
  ForceFieldOptions *in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *in_stack_fffffffffffffca8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcb0;
  locale *in_stack_fffffffffffffcb8;
  AtomType *in_stack_fffffffffffffcc0;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcd0;
  EAM *in_stack_fffffffffffffcd8;
  ForceField *in_stack_fffffffffffffce0;
  AtomType *in_stack_fffffffffffffce8;
  AtomType *in_stack_fffffffffffffcf0;
  EAMInteractionType *local_2a8;
  vector<double,_std::allocator<double>_> *phiVals;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  int nr_00;
  RealType dr_00;
  undefined5 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdfd;
  undefined1 in_stack_fffffffffffffdfe;
  EAM *this_02;
  locale *this_03;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *in_stack_fffffffffffffe58;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe60;
  locale *in_stack_fffffffffffffe68;
  AtomType *in_stack_fffffffffffffe70;
  AtomType *in_stack_fffffffffffffe78;
  EAM *in_stack_fffffffffffffe80;
  ForceField *re_00;
  AtomType *atype1;
  string local_110 [32];
  string local_f0 [32];
  EAMInteractionType *local_d0;
  AtomType *local_c8;
  AtomType *local_c0;
  vector<double,_std::allocator<double>_> local_b8;
  ForceFieldOptions *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  undefined1 local_80 [16];
  _Self local_70;
  _Base_ptr local_68;
  _Self local_60;
  _Base_ptr local_58;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> local_50;
  undefined4 local_48;
  locale local_38 [8];
  string local_30 [32];
  ForceFieldOptions *local_10;
  
  local_10 = ForceField::getForceFieldOptions(*(ForceField **)(in_RDI + 0x90));
  ForceFieldOptions::getEAMMixingMethod_abi_cxx11_(in_stack_fffffffffffffc98);
  this_03 = local_38;
  std::locale::locale(this_03);
  toUpper<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  std::locale::~locale(local_38);
  bVar1 = std::operator==(in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
  if (bVar1) {
    *(undefined4 *)(in_RDI + 0xf8) = 0;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
    if (bVar1) {
      *(undefined4 *)(in_RDI + 0xf8) = 2;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
      if (bVar1) {
        *(undefined4 *)(in_RDI + 0xf8) = 3;
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
        if (bVar1) {
          *(undefined4 *)(in_RDI + 0xf8) = 1;
        }
        else {
          *(undefined4 *)(in_RDI + 0xf8) = 4;
        }
      }
    }
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3c7c0f);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x3c7c28);
  std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::clear
            ((vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_> *)0x3c7c39);
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::clear((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
           *)0x3c7c4a);
  *(undefined4 *)(in_RDI + 0x88) = 0;
  ForceField::getNAtomType((ForceField *)0x3c7c68);
  local_48 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffcd0,CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8)
             ,(value_type_conflict2 *)in_stack_fffffffffffffcc0);
  std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::_Rb_tree_const_iterator(&local_50);
  local_58 = (_Base_ptr)
             std::
             set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
             begin((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                    *)in_stack_fffffffffffffc98);
  local_50._M_node = local_58;
  while( true ) {
    local_60._M_node =
         (_Base_ptr)
         std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
         ::end((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                *)in_stack_fffffffffffffc98);
    bVar1 = std::operator!=(&local_50,&local_60);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
              ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)in_stack_fffffffffffffca0);
    bVar1 = AtomType::isEAM((AtomType *)in_stack_fffffffffffffce0);
    if (bVar1) {
      *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) + 1;
    }
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator++
              ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)in_stack_fffffffffffffca0);
  }
  std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::resize
            ((vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_> *)
             in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::resize((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
            *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
  local_68 = (_Base_ptr)
             std::
             set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
             begin((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                    *)in_stack_fffffffffffffc98);
  local_50._M_node = local_68;
  while( true ) {
    local_70._M_node =
         (_Base_ptr)
         std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
         ::end((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                *)in_stack_fffffffffffffc98);
    bVar1 = std::operator!=(&local_50,&local_70);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
              ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)in_stack_fffffffffffffca0);
    bVar1 = AtomType::isEAM((AtomType *)in_stack_fffffffffffffce0);
    if (bVar1) {
      std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
                ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)in_stack_fffffffffffffca0);
      addType(in_stack_00000850,in_stack_00000848);
    }
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator++
              ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)in_stack_fffffffffffffca0);
  }
  local_80._8_8_ = ForceField::getNonBondedInteractionTypes(*(ForceField **)(in_RDI + 0x90));
  this_02 = (EAM *)local_80;
  std::
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::NonBondedInteractionType_*>_>_>
  ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::NonBondedInteractionType_*>_>_>
                       *)this_02);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3c7eaf);
  local_a0 = (ForceFieldOptions *)
             TypeContainer<OpenMD::NonBondedInteractionType,_2>::beginType
                       ((TypeContainer<OpenMD::NonBondedInteractionType,_2> *)
                        in_stack_fffffffffffffcc0,(MapTypeIterator *)in_stack_fffffffffffffcb8);
  while (local_a0 != (ForceFieldOptions *)0x0) {
    uVar2 = NonBondedInteractionType::isEAMTable((NonBondedInteractionType *)local_a0);
    if ((((bool)uVar2) ||
        (in_stack_fffffffffffffdfe =
              NonBondedInteractionType::isEAMZhou((NonBondedInteractionType *)local_a0),
        (bool)in_stack_fffffffffffffdfe)) ||
       (in_stack_fffffffffffffdfd =
             NonBondedInteractionType::isEAMOxides((NonBondedInteractionType *)local_a0),
       (bool)in_stack_fffffffffffffdfd)) {
      TypeContainer<OpenMD::NonBondedInteractionType,_2>::getKeys
                (in_stack_fffffffffffffca8,(MapTypeIterator *)in_stack_fffffffffffffca0);
      this_01 = &local_98;
      phiVals = &local_b8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffcb0,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffca8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffcb0);
      dr_00 = *(RealType *)(in_RDI + 0x90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](this_01,0);
      nr_00 = (int)((ulong)this_01 >> 0x20);
      pAVar3 = ForceField::getAtomType
                         (in_stack_fffffffffffffce0,(string *)in_stack_fffffffffffffcd8);
      local_c0 = pAVar3;
      if (pAVar3 == (AtomType *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_98,0);
        uVar4 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_98,0);
        uVar5 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_98,1);
        uVar6 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "EAM::initialize could not find AtomType %s\n\tfor %s - %s explicit interaction.\n"
                 ,uVar4,uVar5,uVar6);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_98,1);
      local_c8 = ForceField::getAtomType
                           (in_stack_fffffffffffffce0,(string *)in_stack_fffffffffffffcd8);
      if (local_c8 == (AtomType *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_98,1);
        uVar4 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_98,0);
        uVar5 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_98,1);
        uVar6 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "EAM::initialize could not find AtomType %s\n\tfor %s - %s explicit interaction.\n"
                 ,uVar4,uVar5,uVar6);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      if (local_a0 == (ForceFieldOptions *)0x0) {
        local_2a8 = (EAMInteractionType *)0x0;
      }
      else {
        local_2a8 = (EAMInteractionType *)
                    __dynamic_cast(local_a0,&NonBondedInteractionType::typeinfo,
                                   &EAMInteractionType::typeinfo,0);
      }
      local_d0 = local_2a8;
      if (local_2a8 == (EAMInteractionType *)0x0) {
        AtomType::getName_abi_cxx11_((AtomType *)in_stack_fffffffffffffc98);
        uVar4 = std::__cxx11::string::c_str();
        AtomType::getName_abi_cxx11_((AtomType *)in_stack_fffffffffffffc98);
        uVar5 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "EAM::initialize could not convert NonBondedInteractionType\n\tto EAMInteractionType for %s - %s interaction.\n"
                 ,uVar4,uVar5);
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::~string(local_f0);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      bVar1 = NonBondedInteractionType::isEAMTable((NonBondedInteractionType *)local_a0);
      if (bVar1) {
        EAMInteractionType::getPhi((EAMInteractionType *)in_stack_fffffffffffffc98);
        EAMInteractionType::getDr(local_d0);
        EAMInteractionType::getNr(local_d0);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcf0,
                   (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffce8);
        addExplicitInteraction
                  (this_02,(AtomType *)
                           CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffdfe,
                                                   CONCAT15(in_stack_fffffffffffffdfd,
                                                            in_stack_fffffffffffffdf8))),pAVar3,
                   dr_00,nr_00,phiVals);
        std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffcb0);
        std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffcb0);
      }
      else {
        bVar1 = NonBondedInteractionType::isEAMZhou((NonBondedInteractionType *)local_a0);
        if (bVar1) {
          EAMInteractionType::getRe(local_d0);
          this_00 = (EAM *)EAMInteractionType::getAlpha(local_d0);
          in_stack_fffffffffffffcf0 = (AtomType *)EAMInteractionType::getBeta(local_d0);
          atype1 = in_stack_fffffffffffffcf0;
          in_stack_fffffffffffffce8 = (AtomType *)EAMInteractionType::getA(local_d0);
          pAVar3 = in_stack_fffffffffffffce8;
          in_stack_fffffffffffffce0 = (ForceField *)EAMInteractionType::getB(local_d0);
          re_00 = in_stack_fffffffffffffce0;
          in_stack_fffffffffffffcd8 = (EAM *)EAMInteractionType::getKappa(local_d0);
          in_stack_fffffffffffffe80 = in_stack_fffffffffffffcd8;
          in_stack_fffffffffffffe78 = (AtomType *)EAMInteractionType::getLambda(local_d0);
          addExplicitInteraction
                    (this_00,atype1,pAVar3,(RealType)re_00,(RealType)in_stack_fffffffffffffe80,
                     (RealType)in_stack_fffffffffffffe78,(RealType)in_stack_fffffffffffffe70,
                     (RealType)in_stack_fffffffffffffe68,(RealType)in_stack_fffffffffffffe60,
                     (RealType)in_stack_fffffffffffffe58);
        }
        else {
          bVar1 = NonBondedInteractionType::isEAMOxides((NonBondedInteractionType *)local_a0);
          if (bVar1) {
            in_stack_fffffffffffffcc0 = (AtomType *)EAMInteractionType::getRe(local_d0);
            in_stack_fffffffffffffe70 = in_stack_fffffffffffffcc0;
            in_stack_fffffffffffffcb8 = (locale *)EAMInteractionType::getAlpha(local_d0);
            in_stack_fffffffffffffe68 = in_stack_fffffffffffffcb8;
            in_stack_fffffffffffffcb0 =
                 (vector<double,_std::allocator<double>_> *)EAMInteractionType::getA(local_d0);
            in_stack_fffffffffffffe60 = in_stack_fffffffffffffcb0;
            in_stack_fffffffffffffca8 =
                 (TypeContainer<OpenMD::NonBondedInteractionType,_2> *)
                 EAMInteractionType::getCi(local_d0);
            in_stack_fffffffffffffe58 = in_stack_fffffffffffffca8;
            in_stack_fffffffffffffca0 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 EAMInteractionType::getCj(local_d0);
            addExplicitInteraction
                      (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70
                       ,(RealType)in_stack_fffffffffffffe68,(RealType)in_stack_fffffffffffffe60,
                       (RealType)in_stack_fffffffffffffe58,(RealType)in_stack_fffffffffffffca0,
                       (RealType)this_03);
          }
        }
      }
    }
    in_stack_fffffffffffffc98 =
         (ForceFieldOptions *)
         TypeContainer<OpenMD::NonBondedInteractionType,_2>::nextType
                   ((TypeContainer<OpenMD::NonBondedInteractionType,_2> *)in_stack_fffffffffffffcc0,
                    (MapTypeIterator *)in_stack_fffffffffffffcb8);
    local_a0 = in_stack_fffffffffffffc98;
  }
  *(undefined1 *)(in_RDI + 8) = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffcb0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void EAM::initialize() {
    // set up the mixing method:
    ForceFieldOptions& fopts = forceField_->getForceFieldOptions();
    string EAMMixMeth        = fopts.getEAMMixingMethod();
    toUpper(EAMMixMeth);
    if (EAMMixMeth == "JOHNSON")
      mixMeth_ = eamJohnson;
    else if (EAMMixMeth == "DREAM1")
      mixMeth_ = eamDream1;
    else if (EAMMixMeth == "DREAM2")
      mixMeth_ = eamDream2;
    else if (EAMMixMeth == "DAW")
      mixMeth_ = eamDaw;
    else
      mixMeth_ = eamUnknownMix;

    // find all of the EAM atom Types:
    EAMtypes.clear();
    EAMtids.clear();
    EAMdata.clear();
    MixingMap.clear();
    nEAM_ = 0;

    EAMtids.resize(forceField_->getNAtomType(), -1);

    AtomTypeSet::iterator at;
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isEAM()) nEAM_++;
    }
    EAMdata.resize(nEAM_);
    MixingMap.resize(nEAM_);

    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isEAM()) addType(*at);
    }

    // find all of the explicit EAM interactions:
    ForceField::NonBondedInteractionTypeContainer* nbiTypes =
        forceField_->getNonBondedInteractionTypes();
    ForceField::NonBondedInteractionTypeContainer::MapTypeIterator j;
    ForceField::NonBondedInteractionTypeContainer::KeyType keys;
    NonBondedInteractionType* nbt;

    for (nbt = nbiTypes->beginType(j); nbt != NULL;
         nbt = nbiTypes->nextType(j)) {
      if (nbt->isEAMTable() || nbt->isEAMZhou() || nbt->isEAMOxides()) {
        keys          = nbiTypes->getKeys(j);
        AtomType* at1 = forceField_->getAtomType(keys[0]);
        if (at1 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "EAM::initialize could not find AtomType %s\n"
                   "\tfor %s - %s explicit interaction.\n",
                   keys[0].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        AtomType* at2 = forceField_->getAtomType(keys[1]);
        if (at2 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "EAM::initialize could not find AtomType %s\n"
                   "\tfor %s - %s explicit interaction.\n",
                   keys[1].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        EAMInteractionType* eamit = dynamic_cast<EAMInteractionType*>(nbt);

        if (eamit == NULL) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "EAM::initialize could not convert NonBondedInteractionType\n"
              "\tto EAMInteractionType for %s - %s interaction.\n",
              at1->getName().c_str(), at2->getName().c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
        if (nbt->isEAMTable()) {
          vector<RealType> phiAB = eamit->getPhi();
          RealType dr            = eamit->getDr();
          int nr                 = eamit->getNr();

          addExplicitInteraction(at1, at2, dr, nr, phiAB);

        } else if (nbt->isEAMZhou()) {
          RealType re     = eamit->getRe();
          RealType alpha  = eamit->getAlpha();
          RealType beta   = eamit->getBeta();
          RealType A      = eamit->getA();
          RealType B      = eamit->getB();
          RealType kappa  = eamit->getKappa();
          RealType lambda = eamit->getLambda();

          addExplicitInteraction(at1, at2, re, alpha, beta, A, B, kappa,
                                 lambda);

        } else if (nbt->isEAMOxides()) {
          RealType re    = eamit->getRe();
          RealType alpha = eamit->getAlpha();
          RealType A     = eamit->getA();
          RealType Ci    = eamit->getCi();
          RealType Cj    = eamit->getCj();
          addExplicitInteraction(at1, at2, re, alpha, A, Ci, Cj);
        }
      }
    }
    initialized_ = true;
  }